

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

PropertySymOpnd * __thiscall
GlobOpt::CreateOpndForTypeCheckOnly(GlobOpt *this,PropertySymOpnd *opnd,Func *func)

{
  code *pcVar1;
  bool bVar2;
  uint16 index;
  undefined4 *puVar3;
  PropertySymOpnd *this_00;
  ObjTypeSpecFldInfo *objTypeSpecFldInfo;
  BVSparse<Memory::JitArenaAllocator> *local_50;
  BVSparse<Memory::JitArenaAllocator> *local_48;
  PropertySymOpnd *newOpnd;
  Func *func_local;
  PropertySymOpnd *opnd_local;
  GlobOpt *this_local;
  
  bVar2 = IR::PropertySymOpnd::IsRootObjectNonConfigurableFieldLoad(opnd);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x35d,"(!opnd->IsRootObjectNonConfigurableFieldLoad())",
                       "!opnd->IsRootObjectNonConfigurableFieldLoad()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = IR::PropertySymOpnd::CopyCommon(opnd,func);
  objTypeSpecFldInfo = IR::PropertySymOpnd::GetObjTypeSpecInfo(opnd);
  IR::PropertySymOpnd::SetObjTypeSpecFldInfo(this_00,objTypeSpecFldInfo);
  bVar2 = IR::PropertySymOpnd::UsesAuxSlot(opnd);
  IR::PropertySymOpnd::SetUsesAuxSlot(this_00,bVar2);
  index = IR::PropertySymOpnd::GetSlotIndex(opnd);
  IR::PropertySymOpnd::SetSlotIndex(this_00,index);
  this_00->field_12 = opnd->field_12;
  IR::PropertySymOpnd::SetTypeCheckOnly(this_00,true);
  *(byte *)&this_00->field_12 = *(byte *)&this_00->field_12 & 0xfd;
  (this_00->finalType).t = (opnd->finalType).t;
  if (opnd->guardedPropOps == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    local_48 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  else {
    local_48 = BVSparse<Memory::JitArenaAllocator>::CopyNew(opnd->guardedPropOps);
  }
  this_00->guardedPropOps = local_48;
  if (opnd->writeGuards == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    local_50 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  else {
    local_50 = BVSparse<Memory::JitArenaAllocator>::CopyNew(opnd->writeGuards);
  }
  this_00->writeGuards = local_50;
  IR::Opnd::SetIsJITOptimizedReg((Opnd *)this_00,true);
  return this_00;
}

Assistant:

IR::PropertySymOpnd *
GlobOpt::CreateOpndForTypeCheckOnly(IR::PropertySymOpnd* opnd, Func* func)
{
    // Used only for CheckObjType instruction today. Future users should make a call
    // whether the new operand is jit optimized in their scenario or not.

    Assert(!opnd->IsRootObjectNonConfigurableFieldLoad());
    IR::PropertySymOpnd *newOpnd = opnd->CopyCommon(func);

    newOpnd->SetObjTypeSpecFldInfo(opnd->GetObjTypeSpecInfo());
    newOpnd->SetUsesAuxSlot(opnd->UsesAuxSlot());
    newOpnd->SetSlotIndex(opnd->GetSlotIndex());

    newOpnd->objTypeSpecFlags = opnd->objTypeSpecFlags;
    // If we're turning the instruction owning this operand into a CheckObjType, we will do a type check here
    // only for the sake of downstream instructions, so the flags pertaining to this property access are
    // irrelevant, because we don't do a property access here.
    newOpnd->SetTypeCheckOnly(true);
    newOpnd->usesFixedValue = false;

    newOpnd->finalType = opnd->finalType;
    newOpnd->guardedPropOps = opnd->guardedPropOps != nullptr ? opnd->guardedPropOps->CopyNew() : nullptr;
    newOpnd->writeGuards = opnd->writeGuards != nullptr ? opnd->writeGuards->CopyNew() : nullptr;

    newOpnd->SetIsJITOptimizedReg(true);

    return newOpnd;
}